

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  nn_queue_item *pnVar10;
  size_t hashed_len;
  undefined8 uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int unaff_EBP;
  nn_fsm_fn p_Var12;
  nn_fsm **ppnVar13;
  nn_usock *self_00;
  nn_fsm *pnVar14;
  nn_fsm *pnVar15;
  long unaff_R12;
  nn_fsm_fn p_Var16;
  undefined4 uVar17;
  nn_fsm *in;
  ulong uVar18;
  bool bVar19;
  char *pos;
  nn_iovec open_request;
  uint8_t rand_key [16];
  nn_fsm *local_e8 [5];
  nn_fsm *local_c0;
  nn_fsm *local_b8;
  nn_fsm *local_b0;
  nn_fsm *local_a8;
  nn_fsm *local_a0;
  nn_fsm *local_98;
  nn_fsm *local_90;
  nn_fsm *local_88;
  nn_fsm *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm *local_60;
  nn_iovec local_58;
  nn_fsm_fn local_48;
  
  in = self + 1;
  iVar2 = 0x1b8358;
  iVar3 = 0x1b8358;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_001ac425;
    if (type != -2) goto LAB_001ac42d;
    if (self[0x33].fn != (nn_fsm_fn)0x0) {
      nn_ws_handshake_handler_cold_35();
LAB_001ac34b:
      nn_ws_handshake_handler_cold_43();
LAB_001ac350:
      iVar2 = unaff_EBP;
      uVar17 = 4;
LAB_001ac3e1:
      *(undefined4 *)&self[0x35].stopped.item.next = uVar17;
LAB_001abfd9:
      if (iVar2 != 1) {
LAB_001abfe0:
        *(undefined4 *)&self[1].fn = 3;
        nn_ws_handshake_server_reply((nn_ws_handshake *)self);
        return;
      }
      p_Var16 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var16;
      if (p_Var16 < (nn_fsm_fn)0x1000) {
        if (p_Var16 < (nn_fsm_fn)0x4) goto LAB_001ac3f7;
        p_Var12 = p_Var16 + (long)((long)&self[4].srcptr + 4);
        uVar18 = 4;
        do {
          iVar2 = bcmp("\r\n\r\n",p_Var12,uVar18);
          if (iVar2 == 0) goto LAB_001ac055;
          p_Var12 = p_Var12 + 1;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
        uVar18 = 0;
LAB_001ac055:
        if (uVar18 < 4) {
          p_Var12 = (nn_fsm_fn)(4 - uVar18);
          self[0x33].shutdown_fn = p_Var12;
          if (p_Var12 + (long)p_Var16 < (nn_fsm_fn)0x1001) {
            pnVar10 = &self[0x32].stopped.item;
            *(int *)&pnVar10->next = *(int *)&pnVar10->next + 1;
            nn_usock_recv(*(nn_usock **)&self[3].stopped.type,p_Var16 + (long)&in->fn,
                          (size_t)p_Var12,(int *)0x0);
            return;
          }
          *(undefined4 *)&self[0x35].stopped.item.next = 1;
          goto LAB_001abfe0;
        }
      }
      else {
        nn_ws_handshake_handler_cold_28();
LAB_001ac3f2:
        nn_ws_handshake_handler_cold_13();
LAB_001ac3f7:
        nn_ws_handshake_handler_cold_27();
LAB_001ac3fc:
        nn_ws_handshake_handler_cold_12();
      }
      nn_ws_handshake_handler_cold_26();
LAB_001ac406:
      nn_ws_handshake_handler_cold_11();
LAB_001ac40b:
      nn_ws_handshake_handler_cold_10();
      goto LAB_001ac410;
    }
    if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) goto LAB_001ac34b;
    nn_timer_start((nn_timer *)&self[1].shutdown_fn,*(int *)&self[3].stopped.srcptr);
    iVar2 = *(int *)((long)&self[1].fn + 4);
    if (iVar2 == 2) {
      p_Var16 = self[0x33].shutdown_fn;
      if (p_Var16 < (nn_fsm_fn)0x1001) {
        *(undefined4 *)&self[1].fn = 2;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        ppnVar13 = &self[4].owner;
        goto LAB_001abf60;
      }
LAB_001ac360:
      nn_ws_handshake_handler_cold_36();
LAB_001ac365:
      nn_ws_handshake_handler_cold_40();
LAB_001ac36a:
      nn_ws_handshake_handler_cold_37();
LAB_001ac36f:
      nn_ws_handshake_handler_cold_38();
LAB_001ac374:
      iVar2 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
      uVar4 = (uint)(iVar2 == 0);
      uVar17 = 6;
      if (iVar2 != 0) {
        uVar17 = 0;
      }
      goto LAB_001ac3df;
    }
    if (iVar2 == 1) {
      if ((nn_fsm_fn)0x200 < self[0x33].shutdown_fn) {
        nn_ws_handshake_handler_cold_41();
        goto LAB_001ac360;
      }
      *(undefined4 *)&in->fn = 4;
      in = (nn_fsm *)&stack0xffffffffffffffb8;
      nn_random_generate(in,0x10);
      hashed_len = 0x19;
      iVar2 = nn_base64_encode((uint8_t *)in,0x10,(char *)local_e8,0x19);
      if (iVar2 < 0) goto LAB_001ac365;
      sVar8 = strlen((char *)local_e8);
      if (sVar8 != 0x18) goto LAB_001ac36a;
      iVar2 = nn_ws_handshake_hash_key
                        ((char *)local_e8,0x18,(char *)&self[0x34].stopped.type,hashed_len);
      if (iVar2 == 0x1c) {
        iVar2 = *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4);
        lVar6 = 8;
        src = 0x1e3c00;
        do {
          if (*(int *)((long)&nn_sws_pipebase_vfptr.recv + lVar6 + 4) == iVar2) {
            ppnVar13 = &self[4].owner;
            uVar11._0_4_ = self[4].state;
            uVar11._4_4_ = self[4].src;
            sprintf((char *)ppnVar13,
                    "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                    ,uVar11,self[4].srcptr,local_e8,
                    *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar6));
            local_58.iov_len = strlen((char *)ppnVar13);
            local_58.iov_base = ppnVar13;
            nn_usock_send(*(nn_usock **)&self[3].stopped.type,&local_58,1);
            return;
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0xa8);
        nn_ws_handshake_handler_cold_39();
        type = extraout_EDX;
        goto switchD_001ab3f6_caseD_5;
      }
      goto LAB_001ac36f;
    }
    goto LAB_001ac48d;
  case 2:
    if (src == 2) goto LAB_001abefa;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_001abf12;
      if (type != 4) goto LAB_001ac4a6;
      in = (nn_fsm *)&self[4].owner;
      pvVar7 = memchr(in,0,0x1000);
      if (pvVar7 == (void *)0x0) goto LAB_001ac3a0;
      sVar8 = strlen((char *)in);
      if (0xfff < sVar8) goto LAB_001ac3aa;
      local_e8[0] = in;
      pcVar9 = strstr((char *)in,"\r\n\r\n");
      if (pcVar9 == (char *)0x0) {
        iVar2 = 1;
        goto LAB_001abfd9;
      }
      self[0x34].srcptr = (void *)0x0;
      self[0x34].owner = (nn_fsm *)0x0;
      self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
      self[0x34].state = 0;
      self[0x34].src = 0;
      self[0x33].stopped.item.next = (nn_queue_item *)0x0;
      self[0x34].fn = (nn_fsm_fn)0x0;
      self[0x33].stopped.srcptr = (void *)0x0;
      *(undefined8 *)&self[0x33].stopped.type = 0;
      self[0x33].stopped.fsm = (nn_fsm *)0x0;
      *(undefined8 *)&self[0x33].stopped.src = 0;
      self[0x33].owner = (nn_fsm *)0x0;
      self[0x33].ctx = (nn_ctx *)0x0;
      self[0x33].state = 0;
      self[0x33].src = 0;
      self[0x33].srcptr = (void *)0x0;
      self[0x35].stopped.fsm = (nn_fsm *)0x0;
      *(undefined8 *)&self[0x35].stopped.src = 0;
      *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
      iVar3 = nn_ws_match_token("GET ",(char **)local_e8,0,iVar3);
      iVar2 = -1;
      if (iVar3 == 0) goto LAB_001abfd9;
      uVar11 = 0;
      iVar3 = nn_ws_match_value(" ",(char **)local_e8,0,0,(char **)&self[0x35].stopped,
                                (size_t *)&self[0x35].stopped.src);
      if (((iVar3 == 0) ||
          (iVar3 = nn_ws_match_token("HTTP/1.1",(char **)local_e8,0,(int)uVar11), iVar3 == 0)) ||
         (iVar3 = nn_ws_match_token("\r\n",(char **)local_e8,0,(int)uVar11), iVar3 == 0))
      goto LAB_001abfd9;
      local_78 = (nn_fsm *)&self[0x33].owner;
      local_c0 = (nn_fsm *)&self[0x33].stopped;
      local_90 = (nn_fsm *)&self[0x33].stopped.srcptr;
      local_a0 = (nn_fsm *)&self[0x34].shutdown_fn;
      local_b0 = (nn_fsm *)&self[0x34].srcptr;
      local_60 = (nn_fsm *)&self[0x33].srcptr;
      local_80 = (nn_fsm *)&self[0x33].ctx;
      local_88 = (nn_fsm *)&self[0x33].stopped.src;
      local_98 = (nn_fsm *)&self[0x33].stopped.type;
      local_a8 = (nn_fsm *)&self[0x34].state;
      local_b8 = (nn_fsm *)&self[0x34].owner;
      local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
      local_70 = (nn_fsm *)&self[0x35].stopped.type;
      do {
        if (*(uint8_t *)&local_e8[0]->fn == '\0') goto LAB_001ac230;
        local_58.iov_base = (char *)0x0;
        local_48 = (nn_fsm_fn)0x0;
        iVar3 = nn_ws_match_token("Host:",(char **)local_e8,1,(int)uVar11);
        pnVar14 = (nn_fsm *)&self[0x33].state;
        pnVar15 = local_60;
        if (((iVar3 != 0) ||
            (iVar3 = nn_ws_match_token("Origin:",(char **)local_e8,1,(int)uVar11),
            pnVar14 = local_78, pnVar15 = local_80, iVar3 != 0)) ||
           ((iVar3 = nn_ws_match_token("Sec-WebSocket-Key:",(char **)local_e8,1,(int)uVar11),
            pnVar14 = local_c0, pnVar15 = local_88, iVar3 != 0 ||
            (iVar3 = nn_ws_match_token("Upgrade:",(char **)local_e8,1,(int)uVar11),
            pnVar14 = local_90, pnVar15 = local_98, iVar3 != 0)))) goto LAB_001abcab;
        iVar3 = nn_ws_match_token("Connection:",(char **)local_e8,1,(int)uVar11);
        if (iVar3 == 0) {
          iVar3 = nn_ws_match_token("Sec-WebSocket-Version:",(char **)local_e8,1,(int)uVar11);
          pnVar14 = local_a0;
          pnVar15 = local_a8;
          if (((iVar3 != 0) ||
              (iVar3 = nn_ws_match_token("Sec-WebSocket-Protocol:",(char **)local_e8,1,(int)uVar11),
              pnVar14 = local_b0, pnVar15 = local_b8, iVar3 != 0)) ||
             (iVar3 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_e8,1,(int)uVar11)
             , pnVar14 = local_68, pnVar15 = local_70, iVar3 != 0)) {
LAB_001abcab:
            uVar11 = 1;
            uVar4 = nn_ws_match_value("\r\n",(char **)local_e8,1,1,(char **)pnVar14,
                                      (size_t *)pnVar15);
            goto LAB_001abcb3;
          }
          iVar3 = nn_ws_match_token("\r\n",(char **)local_e8,1,(int)uVar11);
          uVar4 = 7;
          if (iVar3 == 0) {
            pnVar14 = (nn_fsm *)0x0;
            pnVar15 = (nn_fsm *)0x0;
            goto LAB_001abcab;
          }
        }
        else {
          uVar11 = 1;
          uVar4 = nn_ws_match_value("\r\n",(char **)local_e8,1,1,(char **)&local_58,
                                    (size_t *)&stack0xffffffffffffffb8);
          pnVar10 = (nn_queue_item *)nn_strcasestr((char *)local_58.iov_base,"upgrade");
          self[0x33].stopped.item.next = pnVar10;
          if (pnVar10 != (nn_queue_item *)0x0) {
            self[0x34].fn = (nn_fsm_fn)0x7;
          }
LAB_001abcb3:
          uVar4 = uVar4 ^ 1;
        }
      } while (uVar4 == 0);
      if (uVar4 != 7) goto LAB_001abfd9;
LAB_001ac230:
      if (*(uint8_t *)&local_e8[0]->fn == '\0') {
        iVar2 = -1;
        uVar17 = 3;
        lVar6._0_4_ = self[0x33].state;
        lVar6._4_4_ = self[0x33].src;
        if ((((lVar6 == 0) || (pnVar14 = (nn_fsm *)local_90->fn, pnVar14 == (nn_fsm *)0x0)) ||
            (pnVar10 = self[0x33].stopped.item.next, pnVar10 == (nn_queue_item *)0x0)) ||
           (((nn_fsm *)local_c0->fn == (nn_fsm *)0x0 || ((nn_fsm *)local_a0->fn == (nn_fsm *)0x0))))
        goto LAB_001ac3e1;
        iVar3 = nn_ws_validate_value("13",(char *)local_a0->fn,(size_t)local_a8->fn,(int)uVar11);
        unaff_EBP = -1;
        if (iVar3 != 0) {
          iVar3 = nn_ws_validate_value("websocket",(char *)pnVar14,(size_t)local_98->fn,(int)uVar11)
          ;
          if ((iVar3 != 0) &&
             (iVar3 = nn_ws_validate_value
                                ("Upgrade",(char *)pnVar10,(size_t)self[0x34].fn,(int)uVar11),
             iVar3 != 0)) {
            pnVar14 = (nn_fsm *)local_b0->fn;
            if (pnVar14 != (nn_fsm *)0x0) {
              pnVar15 = (nn_fsm *)local_b8->fn;
              unaff_R12 = 8;
              uVar17 = 7;
              do {
                iVar3 = nn_ws_validate_value
                                  (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + unaff_R12),
                                   (char *)pnVar14,(size_t)pnVar15,(int)uVar11);
                if (iVar3 != 0) goto LAB_001ac3af;
                unaff_R12 = unaff_R12 + 0x10;
              } while (unaff_R12 != 0xa8);
              goto LAB_001ac3e1;
            }
            goto LAB_001ac374;
          }
          goto LAB_001ac3e1;
        }
        goto LAB_001ac350;
      }
LAB_001ac410:
      nn_ws_handshake_handler_cold_25();
      goto switchD_001ab3f6_default;
    }
    goto LAB_001ac457;
  case 3:
    if (src == 2) goto LAB_001abedc;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_001abf12;
      if (type == 3) goto LAB_001ac16f;
      src = type;
      nn_ws_handshake_handler_cold_22();
      type = extraout_EDX_00;
      goto switchD_001ab3f6_caseD_4;
    }
    goto LAB_001ac43f;
  case 4:
switchD_001ab3f6_caseD_4:
    if (src == 2) goto LAB_001abeeb;
    if (src != 1) goto LAB_001ac447;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001abf12;
    if (type == 3) {
      *(undefined4 *)&self[1].fn = 5;
      self_00 = *(nn_usock **)&self[3].stopped.type;
      p_Var16 = self[0x33].shutdown_fn;
      ppnVar13 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
LAB_001abf60:
      nn_usock_recv(self_00,ppnVar13,(size_t)p_Var16,(int *)0x0);
      return;
    }
    break;
  case 5:
switchD_001ab3f6_caseD_5:
    if (src == 2) {
      if (type == 1) goto LAB_001abf12;
      nn_ws_handshake_handler_cold_9();
      type = extraout_EDX_02;
LAB_001abedc:
      if (type == 1) goto LAB_001abf12;
      nn_ws_handshake_handler_cold_21();
      type = extraout_EDX_03;
LAB_001abeeb:
      if (type == 1) goto LAB_001abf12;
      nn_ws_handshake_handler_cold_18();
      type = extraout_EDX_04;
LAB_001abefa:
      if (type == 1) goto LAB_001abf12;
      nn_ws_handshake_handler_cold_24();
      type = extraout_EDX_05;
LAB_001abf09:
      if (type == 1) {
LAB_001abf12:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      goto LAB_001ac483;
    }
    if (src != 1) goto LAB_001ac437;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001abf12;
    if (type == 4) {
      in = (nn_fsm *)((long)&self[0x35].stopped.item.next + 4);
      pvVar7 = memchr(in,0,0x200);
      if (pvVar7 == (void *)0x0) {
        nn_ws_handshake_handler_cold_15();
LAB_001ac3a0:
        nn_ws_handshake_handler_cold_30();
LAB_001ac3a5:
        nn_ws_handshake_handler_cold_14();
LAB_001ac3aa:
        nn_ws_handshake_handler_cold_29();
LAB_001ac3af:
        bVar19 = *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) !=
                 *(int *)((long)&nn_sws_pipebase_vfptr.recv + unaff_R12);
        uVar4 = (uint)bVar19;
        uVar17 = 6;
        if (!bVar19) {
          uVar17 = 0;
        }
LAB_001ac3df:
        iVar2 = -uVar4;
        goto LAB_001ac3e1;
      }
      sVar8 = strlen((char *)in);
      if (0x1ff < sVar8) goto LAB_001ac3a5;
      local_e8[0] = in;
      pcVar9 = strstr((char *)in,"\r\n\r\n");
      iVar3 = 1;
      if (pcVar9 != (char *)0x0) {
        *(undefined8 *)&self[0x34].stopped.src = 0;
        self[0x34].stopped.srcptr = (void *)0x0;
        self[0x34].ctx = (nn_ctx *)0x0;
        self[0x34].stopped.fsm = (nn_fsm *)0x0;
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x35].state = 0;
        self[0x35].src = 0;
        self[0x35].srcptr = (void *)0x0;
        self[0x35].owner = (nn_fsm *)0x0;
        self[0x35].ctx = (nn_ctx *)0x0;
        iVar2 = nn_ws_match_token("HTTP/1.1 ",(char **)local_e8,0,iVar2);
        if (iVar2 != 0) {
          iVar2 = nn_ws_match_value(" ",(char **)local_e8,0,0,(char **)&self[0x35].state,
                                    (size_t *)&self[0x35].srcptr);
          if (iVar2 != 0) {
            uVar11 = 0;
            iVar2 = nn_ws_match_value("\r\n",(char **)local_e8,0,0,(char **)&self[0x35].owner,
                                      (size_t *)&self[0x35].ctx);
            if (iVar2 != 0) {
              piVar1 = &self[0x34].stopped.src;
              local_78 = (nn_fsm *)&self[0x33].stopped.srcptr;
              local_c0 = (nn_fsm *)&self[0x33].stopped.item;
              local_98 = (nn_fsm *)&self[0x34].shutdown_fn;
              local_b0 = (nn_fsm *)&self[0x34].srcptr;
              local_60 = (nn_fsm *)&self[0x34].stopped.srcptr;
              local_80 = (nn_fsm *)&self[0x33].stopped.type;
              local_88 = self + 0x34;
              local_a0 = (nn_fsm *)&self[0x34].state;
              local_b8 = (nn_fsm *)&self[0x34].owner;
              local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
              local_70 = (nn_fsm *)&self[0x35].stopped.type;
              local_a8 = (nn_fsm *)&self[0x35].srcptr;
              local_90 = (nn_fsm *)&self[0x35].state;
              do {
                iVar2 = (int)uVar11;
                if (*(uint8_t *)&local_e8[0]->fn == '\0') {
LAB_001ac0a8:
                  if (*(uint8_t *)&local_e8[0]->fn != '\0') goto LAB_001ac40b;
                  iVar3 = -1;
                  if (((((nn_fsm *)local_90->fn != (nn_fsm *)0x0) &&
                       (pnVar14 = (nn_fsm *)local_78->fn, pnVar14 != (nn_fsm *)0x0)) &&
                      ((pnVar15 = (nn_fsm *)local_c0->fn, pnVar15 != (nn_fsm *)0x0 &&
                       (((pcVar9 = *(char **)piVar1, pcVar9 != (char *)0x0 &&
                         (iVar5 = nn_ws_validate_value
                                            ("101",(char *)local_90->fn,(size_t)local_a8->fn,iVar2),
                         iVar5 != 0)) &&
                        (iVar5 = nn_ws_validate_value
                                           ("websocket",(char *)pnVar14,(size_t)local_80->fn,iVar2),
                        iVar5 != 0)))))) &&
                     (iVar5 = nn_ws_validate_value
                                        ("Upgrade",(char *)pnVar15,(size_t)local_88->fn,iVar2),
                     iVar5 != 0)) {
                    iVar3 = nn_ws_validate_value
                                      ((char *)&self[0x34].stopped.type,pcVar9,
                                       (size_t)self[0x34].stopped.srcptr,iVar2);
                    iVar3 = iVar3 + -1;
                  }
                  goto LAB_001ac162;
                }
                iVar3 = nn_ws_match_token("Server:",(char **)local_e8,1,iVar2);
                pnVar14 = (nn_fsm *)&self[0x34].ctx;
                pnVar15 = (nn_fsm *)&self[0x34].stopped;
                if (((((iVar3 == 0) &&
                      (iVar3 = nn_ws_match_token("Sec-WebSocket-Accept:",(char **)local_e8,1,iVar2),
                      pnVar14 = (nn_fsm *)piVar1, pnVar15 = local_60, iVar3 == 0)) &&
                     (iVar3 = nn_ws_match_token("Upgrade:",(char **)local_e8,1,iVar2),
                     pnVar14 = local_78, pnVar15 = local_80, iVar3 == 0)) &&
                    ((iVar3 = nn_ws_match_token("Connection:",(char **)local_e8,1,iVar2),
                     pnVar14 = local_c0, pnVar15 = local_88, iVar3 == 0 &&
                     (iVar3 = nn_ws_match_token("Sec-WebSocket-Version-Server:",(char **)local_e8,1,
                                                iVar2), pnVar14 = local_98, pnVar15 = local_a0,
                     iVar3 == 0)))) &&
                   ((iVar3 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",(char **)local_e8,1,
                                               iVar2), pnVar14 = local_b0, pnVar15 = local_b8,
                    iVar3 == 0 &&
                    (iVar3 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_e8,1,iVar2
                                              ), pnVar14 = local_68, pnVar15 = local_70, iVar3 == 0)
                    ))) {
                  iVar3 = nn_ws_match_token("\r\n",(char **)local_e8,1,iVar2);
                  if (iVar3 != 0) goto LAB_001ac0a8;
                  pnVar14 = (nn_fsm *)0x0;
                  pnVar15 = (nn_fsm *)0x0;
                }
                uVar11 = 1;
                iVar2 = nn_ws_match_value("\r\n",(char **)local_e8,1,1,(char **)pnVar14,
                                          (size_t *)pnVar15);
              } while (iVar2 != 0);
              iVar3 = 1;
            }
          }
        }
      }
LAB_001ac162:
      if (iVar3 != 1) {
        if (iVar3 == 0) {
LAB_001ac16f:
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 8;
          return;
        }
        goto LAB_001abf12;
      }
      p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var12;
      if ((nn_fsm_fn)0x1ff < p_Var12) goto LAB_001ac3f2;
      if (p_Var12 < (nn_fsm_fn)0x4) goto LAB_001ac3fc;
      p_Var16 = p_Var12 + (long)&self[0x35].stopped.item;
      uVar18 = 4;
      do {
        iVar2 = bcmp("\r\n\r\n",p_Var16,uVar18);
        if (iVar2 == 0) goto LAB_001ac1e5;
        p_Var16 = p_Var16 + 1;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
      uVar18 = 0;
LAB_001ac1e5:
      if (uVar18 < 4) {
        p_Var16 = (nn_fsm_fn)(4 - uVar18);
        self[0x33].shutdown_fn = p_Var16;
        if ((nn_fsm_fn)0x200 < p_Var16 + (long)p_Var12) goto LAB_001abf12;
        pnVar10 = &self[0x32].stopped.item;
        *(int *)&pnVar10->next = *(int *)&pnVar10->next + 1;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        ppnVar13 = (nn_fsm **)(p_Var12 + (long)&in->fn);
        goto LAB_001abf60;
      }
      goto LAB_001ac406;
    }
    goto LAB_001ac492;
  case 6:
    if (src == 2) goto LAB_001abf09;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_001abf12;
      if (type == 3) goto LAB_001ac16f;
      src = type;
      nn_ws_handshake_handler_cold_7();
      type = extraout_EDX_01;
      goto switchD_001ab3f6_caseD_7;
    }
    goto LAB_001ac45f;
  case 7:
switchD_001ab3f6_caseD_7:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_001ac467;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar2 = 2;
LAB_001abeb7:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x3b].stopped.type,iVar2);
      return;
    }
    goto LAB_001ac479;
  case 8:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_001ac44f;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar2 = 1;
      goto LAB_001abeb7;
    }
    goto LAB_001ac46f;
  default:
switchD_001ab3f6_default:
    nn_ws_handshake_handler_cold_44();
  case 9:
    nn_ws_handshake_handler_cold_1();
LAB_001ac425:
    nn_ws_handshake_handler_cold_33();
LAB_001ac42d:
    nn_ws_handshake_handler_cold_34();
LAB_001ac437:
    nn_ws_handshake_handler_cold_17();
LAB_001ac43f:
    nn_ws_handshake_handler_cold_23();
LAB_001ac447:
    nn_ws_handshake_handler_cold_20();
LAB_001ac44f:
    nn_ws_handshake_handler_cold_3();
LAB_001ac457:
    nn_ws_handshake_handler_cold_32();
LAB_001ac45f:
    nn_ws_handshake_handler_cold_8();
LAB_001ac467:
    nn_ws_handshake_handler_cold_5();
LAB_001ac46f:
    nn_ws_handshake_handler_cold_2();
LAB_001ac479:
    nn_ws_handshake_handler_cold_4();
LAB_001ac483:
    nn_ws_handshake_handler_cold_6();
LAB_001ac48d:
    nn_ws_handshake_handler_cold_42();
LAB_001ac492:
    nn_ws_handshake_handler_cold_16();
  }
  nn_ws_handshake_handler_cold_19();
LAB_001ac4a6:
  nn_ws_handshake_handler_cold_31();
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}